

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Manifold.cpp
# Opt level: O0

Manifold * __thiscall mnf::Manifold::description(Manifold *this,string *prefix,bool param_2)

{
  ostream *poVar1;
  string *psVar2;
  byte in_CL;
  undefined7 in_register_00000011;
  stringstream local_1b0 [8];
  stringstream ss;
  ostream local_1a0 [383];
  byte local_21;
  string *psStack_20;
  bool param_2_local;
  string *prefix_local;
  Manifold *this_local;
  
  psStack_20 = (string *)CONCAT71(in_register_00000011,param_2);
  local_21 = in_CL & 1;
  prefix_local = prefix;
  this_local = this;
  std::__cxx11::stringstream::stringstream(local_1b0);
  poVar1 = std::operator<<(local_1a0,psStack_20);
  psVar2 = name_abi_cxx11_((Manifold *)prefix);
  poVar1 = std::operator<<(poVar1,(string *)psVar2);
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  std::__cxx11::stringstream::str();
  std::__cxx11::stringstream::~stringstream(local_1b0);
  return this;
}

Assistant:

std::string Manifold::description(const std::string& prefix, bool) const
{
  std::stringstream ss;
  ss << prefix << name() << std::endl;
  return ss.str();
}